

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O3

error fail(token *token,char *fmt,...)

{
  int iVar1;
  int iVar2;
  char in_AL;
  int iVar3;
  int iVar4;
  char *__s;
  undefined8 in_RCX;
  pointer *__ptr;
  char *in_RDX;
  ulong __n;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  error *error;
  va_list ap;
  undefined8 local_108;
  error **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  iVar1 = *(int *)(fmt + 0x1c);
  iVar2 = *(int *)(fmt + 0x20);
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar3 = snprintf((char *)0x0,0,"\x1b[1m%s:\x1b[1m%d:%d: \x1b[1;31merror:\x1b[0m ",
                   *(undefined8 *)fmt,(ulong)(iVar1 + 1U),(ulong)(iVar2 + 1U));
  local_100 = &error;
  local_108 = 0x3000000018;
  local_f8 = local_e8;
  iVar4 = vsnprintf((char *)0x0,0,in_RDX,&local_108);
  iVar4 = iVar4 + iVar3 + 1;
  __n = (ulong)iVar4;
  __s = (char *)operator_new__(__n);
  memset(__s,0,__n);
  token->filename = __s;
  snprintf(__s,__n,"\x1b[1m%s:\x1b[1m%d:%d: \x1b[1;31merror:\x1b[0m ",*(undefined8 *)fmt,
           (ulong)(iVar1 + 1U),(ulong)(iVar2 + 1U));
  local_108 = 0x3000000018;
  local_100 = &error;
  local_f8 = local_e8;
  vsnprintf(__s + iVar3,(long)(iVar4 - iVar3),in_RDX,&local_108);
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)token;
}

Assistant:

error fail(const token& token, const char* fmt, ...)
{
    static const char errfmt[] = "\33[1m%s:\33[1m%d:%d: \33[1;31merror:\33[0m ";

    const int line = token.line + 1;
    const int column = token.column + 1;

    const int first_length = std::snprintf(NULL, 0, errfmt, token.filename, line, column);
    std::va_list ap;
    va_start(ap, fmt);
    const int second_length = std::vsnprintf(NULL, 0, fmt, ap);
    va_end(ap);

    const int length = first_length + second_length + 1;
    error error;
    error.message = std::make_unique<char[]>(length);

    std::snprintf(error.message.get(), length, errfmt, token.filename, line, column);
    va_start(ap, fmt);
    std::vsnprintf(error.message.get() + first_length, length - first_length, fmt, ap);
    va_end(ap);

    return error;
}